

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_gprim_predefined<tinyusdz::GeomSphere>
                   (string *__return_storage_ptr__,GeomSphere *gprim,uint32_t indent)

{
  GPrim *pGVar1;
  bool bVar2;
  Relationship *this;
  uint32_t indent_00;
  GeomSphere *pGVar3;
  tinyusdz *local_448;
  tinyusdz *local_3d0;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  ListEditQual local_37c;
  string local_378;
  Relationship *local_358;
  Relationship *rel;
  string local_330;
  allocator local_309;
  string local_308;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  string local_2a0;
  allocator local_279;
  string local_278;
  string local_258;
  allocator local_231;
  string local_230;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  GeomSphere *pGStack_18;
  uint32_t indent_local;
  GeomSphere *gprim_local;
  
  local_1c = indent;
  pGStack_18 = gprim;
  gprim_local = (GeomSphere *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  pGVar1 = &pGStack_18->super_GPrim;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_1e8,"doubleSided",&local_1e9);
  print_typed_attr<bool>(&local_1c8,&pGVar1->doubleSided,&local_1e8,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  pGVar1 = &pGStack_18->super_GPrim;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_230,"orientation",&local_231);
  print_typed_token_attr<tinyusdz::Orientation>(&local_210,&pGVar1->orientation,&local_230,local_1c)
  ;
  ::std::operator<<(aoStack_198,(string *)&local_210);
  ::std::__cxx11::string::~string((string *)&local_210);
  ::std::__cxx11::string::~string((string *)&local_230);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
  pGVar1 = &pGStack_18->super_GPrim;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_278,"purpose",&local_279);
  print_typed_token_attr<tinyusdz::Purpose>(&local_258,&pGVar1->purpose,&local_278,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_278);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_279);
  pGVar1 = &pGStack_18->super_GPrim;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2c0,"extent",&local_2c1);
  print_typed_attr<tinyusdz::Extent>(&local_2a0,&pGVar1->extent,&local_2c0,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_2a0);
  ::std::__cxx11::string::~string((string *)&local_2a0);
  ::std::__cxx11::string::~string((string *)&local_2c0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  pGVar1 = &pGStack_18->super_GPrim;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_308,"visibility",&local_309);
  print_typed_token_attr<tinyusdz::Visibility>(&local_2e8,&pGVar1->visibility,&local_308,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_2e8);
  ::std::__cxx11::string::~string((string *)&local_2e8);
  ::std::__cxx11::string::~string((string *)&local_308);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_309);
  local_3d0 = (tinyusdz *)0x0;
  if (pGStack_18 != (GeomSphere *)0x0) {
    local_3d0 = (tinyusdz *)&(pGStack_18->super_GPrim).super_MaterialBinding;
  }
  print_material_binding_abi_cxx11_
            (&local_330,local_3d0,(MaterialBinding *)(ulong)local_1c,(uint32_t)pGStack_18);
  ::std::operator<<(aoStack_198,(string *)&local_330);
  ::std::__cxx11::string::~string((string *)&local_330);
  local_448 = (tinyusdz *)0x0;
  if (pGStack_18 != (GeomSphere *)0x0) {
    local_448 = (tinyusdz *)&(pGStack_18->super_GPrim).super_Collection;
  }
  pGVar3 = pGStack_18;
  print_collection_abi_cxx11_
            ((string *)&rel,local_448,(Collection *)(ulong)local_1c,(uint32_t)pGStack_18);
  indent_00 = (uint32_t)pGVar3;
  ::std::operator<<(aoStack_198,(string *)&rel);
  ::std::__cxx11::string::~string((string *)&rel);
  bVar2 = RelationshipProperty::authored(&(pGStack_18->super_GPrim).proxyPrim);
  if (bVar2) {
    this = RelationshipProperty::relationship(&(pGStack_18->super_GPrim).proxyPrim);
    local_358 = this;
    local_37c = Relationship::get_listedit_qual(this);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3a0,"proxyPrim",&local_3a1);
    indent_00 = 0;
    anon_unknown_173::print_relationship(&local_378,this,&local_37c,false,&local_3a0,local_1c);
    ::std::operator<<(aoStack_198,(string *)&local_378);
    ::std::__cxx11::string::~string((string *)&local_378);
    ::std::__cxx11::string::~string((string *)&local_3a0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  }
  print_xformOps_abi_cxx11_
            (&local_3c8,(tinyusdz *)pGStack_18,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(ulong)local_1c,
             indent_00);
  ::std::operator<<(aoStack_198,(string *)&local_3c8);
  ::std::__cxx11::string::~string((string *)&local_3c8);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_gprim_predefined(const T &gprim, const uint32_t indent) {
  std::stringstream ss;

  // properties
  ss << print_typed_attr(gprim.doubleSided, "doubleSided", indent);
  ss << print_typed_token_attr(gprim.orientation, "orientation", indent);
  ss << print_typed_token_attr(gprim.purpose, "purpose", indent);
  ss << print_typed_attr(gprim.extent, "extent", indent);

  ss << print_typed_token_attr(gprim.visibility, "visibility", indent);

  ss << print_material_binding(&gprim, indent);

  ss << print_collection(&gprim, indent);

  if (gprim.proxyPrim.authored()) {
    const Relationship &rel = gprim.proxyPrim.relationship();
    ss << print_relationship(rel, rel.get_listedit_qual(), /* custom */ false,
                             "proxyPrim", indent);
  }

  ss << print_xformOps(gprim.xformOps, indent);

  return ss.str();
}